

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void duckdb::roaring::SetInvalidRange(ValidityMask *result,idx_t start,idx_t end)

{
  ulong uVar1;
  unsigned_long *puVar2;
  InternalException *this;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  allocator local_49;
  string local_48;
  
  if (end < start || end - start == 0) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"SetInvalidRange called with end (%d) <= start (%d)",&local_49);
    InternalException::InternalException<unsigned_long,unsigned_long>(this,&local_48,end,start);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  TemplatedValidityMask<unsigned_long>::EnsureWritable
            (&result->super_TemplatedValidityMask<unsigned_long>);
  puVar2 = (result->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar4 = start & 0x3f;
  iVar3 = start;
  if (uVar4 != 0) {
    uVar1 = (0x40 - uVar4) + start;
    uVar5 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar4 * 8);
    lVar6 = 0x40 - uVar4;
    if (end < uVar1) {
      lVar6 = 0;
      if (end <= uVar1) {
        lVar6 = uVar1 - end;
      }
      uVar5 = uVar5 | (&ValidityUncompressed::UPPER_MASKS)[lVar6];
      lVar6 = end - start;
    }
    iVar3 = lVar6 + start;
    puVar2[start >> 6] = puVar2[start >> 6] & uVar5;
  }
  for (uVar4 = 0; end - iVar3 >> 6 != uVar4; uVar4 = uVar4 + 1) {
    puVar2[(iVar3 >> 6) + uVar4] = 0;
  }
  if ((end - iVar3 & 0x3f) != 0) {
    puVar2[end >> 6] =
         puVar2[end >> 6] & (&ValidityUncompressed::UPPER_MASKS)[0x40 - ((uint)end & 0x3f)];
  }
  return;
}

Assistant:

void SetInvalidRange(ValidityMask &result, idx_t start, idx_t end) {
	if (end <= start) {
		throw InternalException("SetInvalidRange called with end (%d) <= start (%d)", end, start);
	}
	result.EnsureWritable();
	auto result_data = (validity_t *)result.GetData();

#ifdef DEBUG
	ValidityMask copy_for_verification(result.Capacity());
	copy_for_verification.EnsureWritable();
	for (idx_t i = 0;
	     i < AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(result.Capacity()) / ValidityMask::BITS_PER_VALUE; i++) {
		copy_for_verification.GetData()[i] = result.GetData()[i];
	}
#endif
	idx_t index = start;

	if ((index % ValidityMask::BITS_PER_VALUE) != 0) {
		// Adjust the high bits of the first entry

		// +======================================+
		// |xxxxxxxxxxxxxxxxxxxxxxxxx|            |
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t right_bits = index % ValidityMask::BITS_PER_VALUE;
		idx_t bits_to_set = ValidityMask::BITS_PER_VALUE - right_bits;
		idx_t left_bits = 0;
		if (index + bits_to_set > end) {
			// Limit the amount of bits to set
			left_bits = (index + bits_to_set) - end;
			bits_to_set = end - index;
		}

		// Prepare the mask
		validity_t mask = ValidityUncompressed::LOWER_MASKS[right_bits];
		if (left_bits) {
			// Mask off the part that we don't want to touch (if the range doesn't fully cover the bits)
			mask |= ValidityUncompressed::UPPER_MASKS[left_bits];
		}

		idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
		index += bits_to_set;
		result_data[entry_idx] &= mask;
	}

	idx_t remaining_bits = end - index;
	idx_t full_entries = remaining_bits / ValidityMask::BITS_PER_VALUE;
	idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
	// Set all the entries that are fully covered by the range to 0
	for (idx_t i = 0; i < full_entries; i++) {
		result_data[entry_idx + i] = (validity_t)0;
	}

	if ((remaining_bits % ValidityMask::BITS_PER_VALUE) != 0) {
		// The last entry touched by the range is only partially covered

		// +======================================+
		// |                         |xxxxxxxxxxxx|
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t bits_to_set = end % ValidityMask::BITS_PER_VALUE;
		idx_t left_bits = ValidityMask::BITS_PER_VALUE - bits_to_set;
		validity_t mask = ValidityUncompressed::UPPER_MASKS[left_bits];
		idx_t entry_idx = end / ValidityMask::BITS_PER_VALUE;
		result_data[entry_idx] &= mask;
	}

#ifdef DEBUG
	D_ASSERT(end <= result.Capacity());
	for (idx_t i = 0; i < result.Capacity(); i++) {
		if (i >= start && i < end) {
			D_ASSERT(!result.RowIsValidUnsafe(i));
		} else {
			// Ensure no others bits are touched by this method
			D_ASSERT(copy_for_verification.RowIsValidUnsafe(i) == result.RowIsValidUnsafe(i));
		}
	}
#endif
}